

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tstsout.c
# Opt level: O0

int main(int argc,char **argv)

{
  int iVar1;
  char **argv_local;
  int argc_local;
  
  if (argc == 2) {
    check_sysout(argv[1],0);
  }
  else if (argc == 3) {
    iVar1 = strncmp(argv[1],"-v",2);
    if (iVar1 == 0) {
      check_sysout(argv[2],1);
    }
    else {
      usage(*argv);
    }
  }
  else {
    usage(*argv);
  }
  exit(0);
}

Assistant:

int main(int argc, char **argv) {
    switch (argc) {
    case 2:
        check_sysout(argv[1], 0);
        break;
    case 3:
        if (0 == strncmp(argv[1], "-v", 2)) {
            check_sysout(argv[2], 1);
        } else {
            usage(argv[0]);
        }
        break;
    default:
        usage(argv[0]);
    }
  exit(0);
}